

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

sig_proof_t *
sig_proof_from_char_array(picnic_instance_t *pp,picnic_context_t *ctx,uint8_t *data,size_t len)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint diff;
  int iVar10;
  uint uVar11;
  int iVar12;
  sig_proof_t *psVar13;
  undefined8 *puVar14;
  long lVar15;
  ulong in_RCX;
  ulong uVar16;
  ulong uVar17;
  undefined8 *in_RDX;
  long in_RSI;
  ushort *in_RDI;
  bool bVar18;
  uint unruh_g_len;
  uint requested_size;
  uchar ch;
  uint i;
  proof_round_t *round;
  uint base_size;
  uint8_t *tmp;
  size_t remaining_len;
  uint without_input_bytes_size;
  uint input_share_diff;
  uint view_diff;
  uint view_size;
  uint input_output_size;
  uint num_rounds;
  uint seed_size;
  uint digest_size;
  sig_proof_t *proof;
  uint8_t *slab;
  uint local_a0;
  uint local_98;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff84;
  uint8_t *in_stack_ffffffffffffff88;
  sig_proof_t *psVar19;
  uint8_t **in_stack_ffffffffffffff98;
  picnic_context_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long local_30;
  
  local_30 = 0;
  psVar13 = proof_new_verify((picnic_instance_t *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (psVar13 != (sig_proof_t *)0x0) {
    uVar5 = in_RDI[3];
    uVar7 = (uint)*(byte *)((long)in_RDI + 7);
    uVar4 = in_RDI[2];
    uVar8 = (uint)(byte)in_RDI[4];
    uVar9 = (uint)*(byte *)((long)in_RDI + 9);
    bVar1 = *(byte *)((long)in_RDI + 9);
    uVar6 = in_RDI[1];
    bVar2 = *(byte *)((long)in_RDI + 3);
    diff = (uint)(byte)in_RDI[4] * 8 - (uint)*in_RDI;
    iVar10 = uVar9 + uVar8;
    puVar14 = in_RDX;
    uVar11 = collapsed_challenge_size((uint)uVar4);
    uVar16 = in_RCX - uVar11;
    if (uVar11 <= in_RCX) {
      uVar11 = expand_challenge(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                (uint8_t *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      puVar14 = (undefined8 *)((long)puVar14 + (ulong)uVar11);
      if ((puVar14 != in_RDX) &&
         (uVar17 = uVar16 - 0x20, bVar18 = 0x1f >= uVar16,
         -(ulong)bVar18 == (ulong)(0x1f < uVar16) - 1 && !bVar18)) {
        *(undefined8 *)psVar13->salt = *puVar14;
        *(undefined8 *)(psVar13->salt + 8) = puVar14[1];
        *(undefined8 *)(psVar13->salt + 0x10) = puVar14[2];
        *(undefined8 *)(psVar13->salt + 0x18) = puVar14[3];
        puVar14 = puVar14 + 4;
        psVar19 = psVar13 + 1;
        for (uVar11 = 0; uVar11 < uVar4; uVar11 = uVar11 + 1) {
          uVar3 = psVar13->challenge[uVar11];
          local_98 = uVar8;
          if (uVar3 == '\0') {
            local_98 = 0;
          }
          local_98 = (byte)uVar5 + uVar9 + uVar7 * 2 + local_98;
          local_a0 = uVar8;
          if (uVar3 != '\0') {
            local_a0 = 0;
          }
          if ((*(byte *)(in_RSI + 0x68) & 1) != 0) {
            local_98 = iVar10 + local_a0 + local_98;
          }
          bVar18 = uVar17 < local_98;
          uVar17 = uVar17 - local_98;
          if (bVar18) goto LAB_0013fb6a;
          *(undefined8 **)psVar19[1].salt = puVar14;
          lVar15 = (long)puVar14 + (ulong)(uint)(byte)uVar5;
          if ((*(byte *)(in_RSI + 0x68) & 1) != 0) {
            *(long *)(psVar19[3].salt + 0x10) = lVar15;
            lVar15 = lVar15 + (ulong)(iVar10 + local_a0);
          }
          *(long *)psVar19[2].salt = lVar15;
          iVar12 = check_padding_bits(*(uint8_t *)(lVar15 + (ulong)(uVar9 - 1)),
                                      (uint)bVar1 * 8 - (uint)(byte)uVar6 * 3 * (uint)bVar2);
          if (iVar12 != 0) goto LAB_0013fb6a;
          *(ulong *)psVar19->salt = lVar15 + (ulong)uVar9;
          lVar15 = lVar15 + (ulong)uVar9 + (ulong)uVar7;
          *(long *)(psVar19->salt + 8) = lVar15;
          puVar14 = (undefined8 *)(lVar15 + (ulong)uVar7);
          if (uVar3 == '\0') {
            *(long *)(psVar19[1].salt + 8) = local_30;
            *(ulong *)(psVar19[1].salt + 0x10) = local_30 + (ulong)uVar8;
            local_30 = local_30 + (ulong)uVar8 + (ulong)uVar8;
          }
          else if (uVar3 == '\x01') {
            *(long *)(psVar19[1].salt + 8) = local_30;
            local_30 = local_30 + (ulong)uVar8;
            *(undefined8 **)(psVar19[1].salt + 0x10) = puVar14;
            iVar12 = check_padding_bits(*(uint8_t *)((long)puVar14 + (ulong)(uVar8 - 1)),diff);
            if (iVar12 != 0) goto LAB_0013fb6a;
            puVar14 = (undefined8 *)((long)puVar14 + (ulong)uVar8);
          }
          else {
            *(undefined8 **)(psVar19[1].salt + 8) = puVar14;
            iVar12 = check_padding_bits(*(uint8_t *)((long)puVar14 + (ulong)(uVar8 - 1)),diff);
            if (iVar12 != 0) goto LAB_0013fb6a;
            puVar14 = (undefined8 *)((long)puVar14 + (ulong)uVar8);
            *(long *)(psVar19[1].salt + 0x10) = local_30;
            local_30 = local_30 + (ulong)uVar8;
          }
          psVar19 = (sig_proof_t *)(psVar19[3].salt + 0x18);
        }
        if (uVar17 == 0) {
          return psVar13;
        }
      }
    }
LAB_0013fb6a:
    proof_free((sig_proof_t *)0x13fb74);
  }
  return (sig_proof_t *)0x0;
}

Assistant:

static sig_proof_t* sig_proof_from_char_array(const picnic_instance_t* pp,
                                              const picnic_context_t* ctx, const uint8_t* data,
                                              size_t len) {
  uint8_t* slab      = NULL;
  sig_proof_t* proof = proof_new_verify(pp, ctx, &slab);
  if (!proof) {
    return NULL;
  }

  const unsigned int digest_size       = pp->digest_size;
  const unsigned int seed_size         = pp->seed_size;
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int view_diff         = pp->view_size * 8 - 3 * pp->lowmc.m * pp->lowmc.r;
  const unsigned int input_share_diff  = pp->input_output_size * 8 - pp->lowmc.n;
#if defined(WITH_UNRUH)
  const unsigned int without_input_bytes_size = view_size + input_output_size;
#endif

  size_t remaining_len = len;
  const uint8_t* tmp   = data;

  // read and process challenge
  if (sub_overflow_size_t(remaining_len, collapsed_challenge_size(num_rounds), &remaining_len)) {
    goto err;
  }
  tmp += expand_challenge(proof->challenge, num_rounds, tmp);
  if (tmp == data) {
    goto err;
  }

  // read salt
  if (sub_overflow_size_t(remaining_len, SALT_SIZE, &remaining_len)) {
    goto err;
  }
  memcpy(proof->salt, tmp, SALT_SIZE);
  tmp += SALT_SIZE;

  const unsigned int base_size = digest_size + view_size + 2 * seed_size;
  proof_round_t* round         = proof->round;
  for (unsigned int i = 0; i < num_rounds; ++i, ++round) {
    const unsigned char ch      = proof->challenge[i];
    unsigned int requested_size = base_size + (ch ? input_output_size : 0);
#if defined(WITH_UNRUH)
    const unsigned int unruh_g_len = without_input_bytes_size + (ch ? 0 : input_output_size);
    if (ctx->unruh) {
      requested_size += unruh_g_len;
    }
#endif

    if (sub_overflow_size_t(remaining_len, requested_size, &remaining_len)) {
      goto err;
    }

    // read commitments
    round->commitments[2] = (uint8_t*)tmp;
    tmp += digest_size;

#if defined(WITH_UNRUH)
    // read unruh G
    if (ctx->unruh) {
      round->gs[2] = (uint8_t*)tmp;
      tmp += unruh_g_len;
    }
#endif

    // read view
    round->communicated_bits[1] = (uint8_t*)tmp;
    if (check_padding_bits(tmp[view_size - 1], view_diff)) {
      goto err;
    }
    tmp += view_size;

    // read seeds
    round->seeds[0] = (uint8_t*)tmp;
    tmp += seed_size;
    round->seeds[1] = (uint8_t*)tmp;
    tmp += seed_size;

    // read input shares
    switch (ch) {
    case 0:
      round->input_shares[0] = slab;
      slab += input_output_size;
      round->input_shares[1] = slab;
      slab += input_output_size;
      break;
    case 1:
      round->input_shares[0] = slab;
      slab += input_output_size;
      round->input_shares[1] = (uint8_t*)tmp;
      if (check_padding_bits(tmp[input_output_size - 1], input_share_diff)) {
        goto err;
      }
      tmp += input_output_size;
      break;
    default:
      round->input_shares[0] = (uint8_t*)tmp;
      if (check_padding_bits(tmp[input_output_size - 1], input_share_diff)) {
        goto err;
      }
      tmp += input_output_size;
      round->input_shares[1] = slab;
      slab += input_output_size;
    }
  }

  if (remaining_len) {
    goto err;
  }

  return proof;

err:
  proof_free(proof);
  return NULL;
}